

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplicationDifferentiationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Expression expression;
  Variable y;
  Variable x;
  Expression local_148;
  double local_130;
  Expression local_128;
  Variable local_110;
  Variable local_f8;
  int local_dc;
  Expression local_d8;
  char *local_c0;
  long local_b8;
  char local_b0 [16];
  char *local_a0;
  long local_98;
  char local_90 [16];
  char *local_80;
  long local_78;
  char local_70 [16];
  char *local_60;
  long local_58;
  char local_50 [16];
  char *local_40;
  long local_38;
  char local_30 [16];
  
  local_110._vptr_Variable = (_func_int **)0x0;
  local_f8._vptr_Variable = (_func_int **)&PTR_differentiate_0010ebe8;
  local_f8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_f8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_f8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_128,(double *)&local_110);
  local_128._vptr_Expression = (_func_int **)0x0;
  local_110._vptr_Variable = (_func_int **)&PTR_differentiate_0010ebe8;
  local_110.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_110.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_110.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_148,(double *)&local_128);
  (local_f8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_110.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_148,&local_f8,&local_110);
  (*(local_148.m_baseExpressionPtr.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[2])
            (&local_128,
             local_148.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_f8);
  (**(local_128.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  local_130 = extraout_XMM0_Qa;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"d(x * y)/dx != 2","");
  if ((local_130 != 2.0) || (NAN(local_130))) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_40,local_38);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    local_128._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
    if (local_128.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_148._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
    if (local_148.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
              (&local_148,&local_f8,&local_110);
    (*(local_148.m_baseExpressionPtr.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_BaseExpression[2])
              (&local_128,
               local_148.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_110);
    (**(local_128.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_BaseExpression)();
    local_130 = extraout_XMM0_Qa_00;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"d(x * y)/dy != 3","");
    if ((local_130 != 3.0) || (NAN(local_130))) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_60,local_58);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    else {
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      local_128._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
      if (local_128.m_baseExpressionPtr.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.m_baseExpressionPtr.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_148._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
      if (local_148.m_baseExpressionPtr.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.m_baseExpressionPtr.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_dc = 4;
      Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
                (&local_d8,&local_f8,&local_110);
      Kandinsky::operator*<int,_Kandinsky::Expression,_nullptr>(&local_148,&local_dc,&local_d8);
      (*(local_148.m_baseExpressionPtr.
         super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_BaseExpression[2])
                (&local_128,
                 local_148.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_f8);
      (**(local_128.m_baseExpressionPtr.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_BaseExpression)();
      local_130 = extraout_XMM0_Qa_01;
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"y = 2; d(4 * (x * y))/dx != 8","");
      if ((local_130 != 8.0) || (NAN(local_130))) {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_80,local_78);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      else {
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        local_128._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
        if (local_128.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.m_baseExpressionPtr.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_148._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
        if (local_148.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.m_baseExpressionPtr.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_d8._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
        if (local_d8.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.m_baseExpressionPtr.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_d8._vptr_Expression = (_func_int **)CONCAT44(local_d8._vptr_Expression._4_4_,4);
        Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
                  (&local_148,&local_f8,&local_110);
        Kandinsky::operator*<int,_Kandinsky::Expression,_nullptr>
                  (&local_128,(int *)&local_d8,&local_148);
        local_148._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
        if (local_148.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.m_baseExpressionPtr.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        (*(local_128.m_baseExpressionPtr.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_BaseExpression[2])
                  (&local_148,
                   local_128.m_baseExpressionPtr.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_110);
        (**(local_148.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _vptr_BaseExpression)();
        local_130 = extraout_XMM0_Qa_02;
        local_a0 = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"x = 3; d(4 * (x * y))/dy != 12","");
        if ((local_130 != 12.0) || (NAN(local_130))) {
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_a0,local_98);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
        else {
          if (local_a0 != local_90) {
            operator_delete(local_a0);
          }
          local_148._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
          if (local_148.m_baseExpressionPtr.
              super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.m_baseExpressionPtr.
                       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          (local_f8.m_variableExpressionPtr.
           super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_value = 5.0;
          (*(local_128.m_baseExpressionPtr.
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_BaseExpression[2])
                    (&local_148,
                     local_128.m_baseExpressionPtr.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_110);
          (**(local_148.m_baseExpressionPtr.
              super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_BaseExpression)();
          local_130 = extraout_XMM0_Qa_03;
          local_c0 = local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"x = 5; d(4 * (x * y))/dy != 20","");
          if ((local_130 == 20.0) && (!NAN(local_130))) {
            if (local_c0 != local_b0) {
              operator_delete(local_c0);
            }
            local_148._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
            if (local_148.m_baseExpressionPtr.
                super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_148.m_baseExpressionPtr.
                         super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_128._vptr_Expression = (_func_int **)&PTR_variables_0010ec10;
            if (local_128.m_baseExpressionPtr.
                super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_128.m_baseExpressionPtr.
                         super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_110._vptr_Variable = (_func_int **)&PTR_differentiate_0010ebe8;
            if (local_110.m_variableExpressionPtr.
                super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_110.m_variableExpressionPtr.
                         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_f8._vptr_Variable = (_func_int **)&PTR_differentiate_0010ebe8;
            if (local_f8.m_variableExpressionPtr.
                super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f8.m_variableExpressionPtr.
                         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            return 0;
          }
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_c0,local_b8);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
      }
    }
  }
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x * y).differentiate(x).evaluate() == 2, "d(x * y)/dx != 2");
    assertOrExit((x * y).differentiate(y).evaluate() == 3, "d(x * y)/dy != 3");
    assertOrExit((4 * (x * y)).differentiate(x).evaluate() == 8, "y = 2; d(4 * (x * y))/dx != 8");
    Expression expression(4 * (x * y));
    assertOrExit(expression.differentiate(y).evaluate() == 12, "x = 3; d(4 * (x * y))/dy != 12");
    x.setValue(5);
    assertOrExit(expression.differentiate(y).evaluate() == 20, "x = 5; d(4 * (x * y))/dy != 20");
    return 0;
}